

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::print(ANN *this,LayerType type)

{
  size_type sVar1;
  uint local_18;
  uint index;
  LayerType type_local;
  ANN *this_local;
  
  if (type == InputLayer) {
    local_18 = 0;
  }
  else if (type == OutputLayer) {
    sVar1 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    local_18 = (int)sVar1 - 1;
  }
  print(this,local_18);
  return;
}

Assistant:

void ANN::print(LayerType type) const{
    uint index;
    switch (type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    print(index);
}